

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

string * __thiscall ghc::net::uri::request_path_abi_cxx11_(uri *this)

{
  ulong uVar1;
  ostream *poVar2;
  string *psVar3;
  uri *in_RSI;
  string *in_RDI;
  stringstream result;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(&local_188,(string *)&in_RSI->_path);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_188,"?");
    std::operator<<(poVar2,(string *)&in_RSI->_query);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_188,"#");
    psVar3 = fragment_abi_cxx11_(in_RSI);
    std::operator<<(poVar2,(string *)psVar3);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

GHC_INLINE std::string uri::request_path() const
{
    std::stringstream result;
    result << _path;
    if (!_query.empty()) {
        result << "?" << _query;
    }
    if (!_fragment.empty()) {
        result << "#" << fragment();
    }
    return result.str();
}